

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeBufferReader::ReadOneScopeInfo
          (ByteCodeBufferReader *this,byte *current,ByteCodeCache *cache,ScopeInfo **scopeInfo)

{
  byte bVar1;
  code *pcVar2;
  ScopeInfo **ppSVar3;
  uint uVar4;
  bool bVar5;
  BOOL BVar6;
  byte *pbVar7;
  ScopeInfo *pSVar8;
  FunctionInfo *pFVar9;
  undefined4 *puVar10;
  Recycler *this_00;
  ScopeInfo *pSVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte *pbVar16;
  size_t size;
  int iVar17;
  int iVar18;
  ByteCodeBufferReader *this_01;
  long lVar19;
  long lVar20;
  undefined1 local_a0 [8];
  TrackAllocData data;
  LocalFunctionId relativeFunctionId;
  Type local_64;
  ScopeInfo *pSStack_60;
  int scopeType;
  ByteCodeBufferReader *local_58;
  byte *local_50;
  ScopeInfo **local_48;
  ByteCodeCache *local_40;
  uint local_38;
  byte local_32;
  bool local_31;
  int symbolCount;
  ScopeInfoFlags scopeInfoFlags;
  bool hasParent;
  
  local_38 = 0;
  local_48 = scopeInfo;
  pbVar7 = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                     (int *)&local_38);
  data._36_4_ = 0;
  pSVar8 = (ScopeInfo *)
           ReadInt32(pbVar7,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar7)),
                     (int *)&data.field_0x24);
  local_40 = cache;
  pFVar9 = ByteCodeCache::LookupFunctionInfo(cache,this->scriptContext,data._36_4_);
  local_58 = this;
  if (pFVar9 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1182,"(functionInfo != nullptr)","functionInfo != nullptr");
    if (!bVar5) goto LAB_0086d378;
    *puVar10 = 0;
  }
  data.typeinfo = (type_info *)((long)(int)local_38 << 4);
  local_a0 = (undefined1  [8])&ScopeInfo::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_37b2ce4;
  data.filename._0_4_ = 0x1184;
  pSStack_60 = pSVar8;
  this_00 = Memory::Recycler::TrackAllocInfo
                      (local_58->scriptContext->recycler,(TrackAllocData *)local_a0);
  lVar19 = (long)(int)local_38;
  BVar6 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar5) goto LAB_0086d378;
    *puVar10 = 0;
  }
  size = 0xffffffffffffffff;
  if ((ulong)(lVar19 * 0x10) < 0xffffffffffffffd0) {
    size = lVar19 * 0x10 + 0x30;
  }
  pSVar8 = (ScopeInfo *)
           Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                     (this_00,size);
  if (pSVar8 == (ScopeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar5) {
LAB_0086d378:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar10 = 0;
  }
  uVar4 = local_38;
  (pSVar8->parent).ptr = (ScopeInfo *)0x0;
  Memory::Recycler::WBSetBit((char *)&pSVar8->functionInfo);
  (pSVar8->functionInfo).ptr = pFVar9;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar8->functionInfo);
  ppSVar3 = local_48;
  this_01 = local_58;
  *(ushort *)&pSVar8->field_0x10 = *(ushort *)&pSVar8->field_0x10 & 0xfe0f;
  pSVar8->scope = (Type)0x0;
  pSVar8->symbolCount = uVar4;
  *local_48 = pSVar8;
  pbVar7 = ReadByte((byte *)pSStack_60,
                    (size_t)(local_58->raw + ((long)local_58->totalSize - (long)pSStack_60)),
                    &local_32);
  bVar1 = local_32 * '\x02';
  *(ushort *)&(*ppSVar3)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar3)->field_0x10 & 0xfffe | local_32 & 1;
  *(ushort *)&(*ppSVar3)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar3)->field_0x10 & 0xfffd | local_32 & 2;
  *(ushort *)&(*ppSVar3)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar3)->field_0x10 & 0xfffb | local_32 & 4;
  *(ushort *)&(*ppSVar3)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar3)->field_0x10 & 0xfff7 | local_32 & 8;
  *(ushort *)&(*ppSVar3)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar3)->field_0x10 & 0xffdf | (ushort)(bVar1 & 0x20);
  *(ushort *)&(*ppSVar3)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar3)->field_0x10 & 0xffbf | (ushort)(bVar1 & 0x40);
  *(ushort *)&(*ppSVar3)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar3)->field_0x10 & 0xff7f | (ushort)(bVar1 & 0x80);
  *(ushort *)&(*ppSVar3)->field_0x10 = *(ushort *)&(*ppSVar3)->field_0x10 & 0xffef;
  pbVar7 = ReadInt32(pbVar7,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar7)),
                     (int *)&local_64);
  pSVar8 = *ppSVar3;
  pSVar8->scopeType = local_64;
  pbVar7 = ReadInt32(pbVar7,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar7)),
                     &pSVar8->scopeId);
  if (DAT_015bc46a == '\x01') {
    Output::Trace(ByteCodeSerializationPhase,
                  L"Reading ScopeInfo. Flags: %u. Type: %d. ScopeId: %d. Symbol count: %d\n",
                  (ulong)local_32,(ulong)local_64,(ulong)(uint)(*local_48)->scopeId,(ulong)local_38)
    ;
  }
  if (0 < (int)local_38) {
    lVar20 = 0x39;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar19 = 0;
    do {
      pSVar8 = *local_48;
      pbVar7 = ReadByte(pbVar7,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar7)),
                        &local_31);
      bVar12 = local_31 & 1;
      pbVar16 = (byte *)((long)&(pSVar8->parent).ptr + lVar20);
      bVar1 = *pbVar16;
      *pbVar16 = bVar1 & 0xfe | bVar12;
      bVar13 = local_31 & 2;
      *pbVar16 = bVar1 & 0xfc | bVar12 | bVar13;
      bVar14 = local_31 & 4;
      *pbVar16 = bVar1 & 0xf8 | bVar12 | bVar13 | bVar14;
      bVar15 = local_31 & 8;
      *pbVar16 = bVar1 & 0xf0 | bVar12 | bVar13 | bVar14 | bVar15;
      *pbVar16 = bVar1 & 0xe0 | bVar12 | bVar13 | bVar14 | bVar15 | local_31 & 0x10U;
      *pbVar16 = bVar1 & 0xc0 | bVar12 | bVar13 | bVar14 | bVar15 | local_31 & 0x10U |
                 local_31 & 0x20U;
      pSStack_60 = pSVar8;
      pbVar7 = ReadByte(pbVar7,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar7)),
                        pbVar16 + -1);
      pbVar7 = ReadInt32(pbVar7,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar7)),
                         (int *)local_a0);
      iVar18 = local_a0._0_4_ - local_40->builtInPropertyCount;
      iVar17 = local_a0._0_4_;
      if (local_a0._0_4_ != -1 && local_40->builtInPropertyCount <= (int)local_a0._0_4_) {
        if (local_40->propertyCount <= iVar18) {
          AssertCount = AssertCount + 1;
          local_50 = pbVar7;
          Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar5) goto LAB_0086d378;
          *puVar10 = 0;
          pbVar7 = local_50;
        }
        iVar17 = local_40->propertyIds[iVar18];
        if (iVar17 == -1) {
          AssertCount = AssertCount + 1;
          local_50 = pbVar7;
          Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar5) goto LAB_0086d378;
          *puVar10 = 0;
          iVar17 = local_40->propertyIds[iVar18];
          pbVar7 = local_50;
        }
      }
      *(int *)((long)pSStack_60 + lVar20 + -9) = iVar17;
      if (DAT_015bc46a == '\x01') {
        Output::Trace(ByteCodeSerializationPhase,
                      L"\t\tSymbolInfo. Flags: %u. Type: %d. PropertyId: %u\n",(ulong)local_31,
                      (ulong)pbVar16[-1]);
      }
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0x10;
      this_01 = local_58;
    } while (lVar19 < (int)local_38);
  }
  local_31 = false;
  pbVar7 = ReadBool(this_01,pbVar7,&local_31);
  if (local_31 != false) {
    pbVar7 = ReadInt32(pbVar7,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar7)),
                       (int *)local_a0);
    pSVar11 = ByteCodeCache::LookupScopeInfo(local_40,this_01->scriptContext,local_a0._0_4_);
    pSVar8 = *local_48;
    Memory::Recycler::WBSetBit((char *)pSVar8);
    (pSVar8->parent).ptr = pSVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar8);
  }
  return pbVar7;
}

Assistant:

const byte* ReadOneScopeInfo(const byte* current, ByteCodeCache* cache, ScopeInfo** scopeInfo)
    {
        int symbolCount = 0;
        current = ReadInt32(current, &symbolCount);

        Js::LocalFunctionId relativeFunctionId = 0;
        current = ReadUInt32(current, (uint*)&relativeFunctionId);
        FunctionInfo* functionInfo =  cache->LookupFunctionInfo(this->scriptContext, relativeFunctionId);

        Assert(functionInfo != nullptr);

        *scopeInfo = RecyclerNewPlusZ(scriptContext->GetRecycler(), symbolCount * sizeof(ScopeInfo::SymbolInfo), ScopeInfo, functionInfo, symbolCount);

        ScopeInfoFlags scopeInfoFlags;
        current = ReadByte(current, (byte*)&scopeInfoFlags);
        (*scopeInfo)->isDynamic = (scopeInfoFlags & sifIsDynamic) != 0;
        (*scopeInfo)->isObject = (scopeInfoFlags & sifIsObject) != 0;
        (*scopeInfo)->mustInstantiate = (scopeInfoFlags & sifMustInstantiate) != 0;
        (*scopeInfo)->isCached = (scopeInfoFlags & sifIsCached) != 0;
        (*scopeInfo)->hasLocalInClosure = (scopeInfoFlags & sifHasLocalInClosure) != 0;
        (*scopeInfo)->isGeneratorFunctionBody = (scopeInfoFlags & sifIsGeneratorFunctionBody) != 0;
        (*scopeInfo)->isAsyncFunctionBody = (scopeInfoFlags & sifIsAsyncFunctionBody) != 0;
        (*scopeInfo)->areNamesCached = false;

        int scopeType;
        current = ReadInt32(current, &scopeType);
        (*scopeInfo)->scopeType = (::ScopeType)scopeType;

        current = ReadInt32(current, &(*scopeInfo)->scopeId);

        OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("Reading ScopeInfo. Flags: %u. Type: %d. ScopeId: %d. Symbol count: %d\n"), scopeInfoFlags, scopeType, (*scopeInfo)->scopeId, symbolCount);

        for (int i = 0; i < symbolCount; i++)
        {
            ScopeInfo::SymbolInfo* sym = (*scopeInfo)->symbols + i;

            SymbolInfoFlags symbolInfoFlags;
            current = ReadByte(current, (byte*)&symbolInfoFlags);
            sym->hasFuncAssignment = (symbolInfoFlags & syifHasFuncAssignment) != 0;
            sym->isBlockVariable = (symbolInfoFlags & syifIsBlockVariable) != 0;
            sym->isConst = (symbolInfoFlags & syifIsConst) != 0;
            sym->isFuncExpr = (symbolInfoFlags & syifIsFuncExpr) != 0;
            sym->isModuleExportStorage = (symbolInfoFlags & syifIsModuleExportStorage) != 0;
            sym->isModuleImport = (symbolInfoFlags & syifIsModuleImport) != 0;

            current = ReadByte(current, (BYTE*)&sym->symbolType);

            PropertyId obscuredPropertyId;
            current = ReadInt32(current, (int*)&obscuredPropertyId);
            sym->propertyId = cache->LookupPropertyId(obscuredPropertyId);

            OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("\t\tSymbolInfo. Flags: %u. Type: %d. PropertyId: %u\n"), symbolInfoFlags, sym->symbolType, sym->propertyId);
        }

        bool hasParent = false;
        current = ReadBool(current, &hasParent);

        if (hasParent)
        {
            ScopeInfo* parent = nullptr;
            current = ReadScopeInfo(current, cache, &parent);
            (*scopeInfo)->parent = parent;
        }

        return current;
    }